

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olsrv2_writer.c
# Opt level: O2

int olsrv2_writer_init(oonf_rfc5444_protocol *protocol)

{
  int iVar1;
  rfc5444_writer_message *prVar2;
  int iVar3;
  
  iVar3 = 0;
  _protocol = protocol;
  prVar2 = rfc5444_writer_register_message(&protocol->writer,'\x01',false);
  _olsrv2_message = prVar2;
  if (prVar2 == (rfc5444_writer_message *)0x0) {
    iVar3 = -1;
    if ((log_global_mask[LOG_OLSRV2] & 4) != 0) {
      oonf_log(LOG_SEVERITY_WARN,LOG_OLSRV2,"src/olsrv2/olsrv2/olsrv2_writer.c",0x8a,(void *)0x0,0,
               "Could not register OLSRV2 TC message");
    }
  }
  else {
    prVar2->addMessageHeader = _cb_addMessageHeader;
    prVar2->finishMessageHeader = _cb_finishMessageHeader;
    prVar2->forward_target_selector = nhdp_forwarding_selector;
    iVar1 = rfc5444_writer_register_msgcontentprovider
                      (&_protocol->writer,&_olsrv2_msgcontent_provider,_olsrv2_addrtlvs,5);
    if (iVar1 != 0) {
      if ((log_global_mask[LOG_OLSRV2] & 4) != 0) {
        oonf_log(LOG_SEVERITY_WARN,LOG_OLSRV2,"src/olsrv2/olsrv2/olsrv2_writer.c",0x94,(void *)0x0,0
                 ,"Count not register OLSRV2 msg contentprovider");
      }
      rfc5444_writer_unregister_message(&_protocol->writer,_olsrv2_message);
      iVar3 = -1;
    }
  }
  return iVar3;
}

Assistant:

int
olsrv2_writer_init(struct oonf_rfc5444_protocol *protocol) {
  _protocol = protocol;

  _olsrv2_message = rfc5444_writer_register_message(&_protocol->writer, RFC7181_MSGTYPE_TC, false);
  if (_olsrv2_message == NULL) {
    OONF_WARN(LOG_OLSRV2, "Could not register OLSRV2 TC message");
    return -1;
  }

  _olsrv2_message->addMessageHeader = _cb_addMessageHeader;
  _olsrv2_message->finishMessageHeader = _cb_finishMessageHeader;
  _olsrv2_message->forward_target_selector = nhdp_forwarding_selector;

  if (rfc5444_writer_register_msgcontentprovider(
        &_protocol->writer, &_olsrv2_msgcontent_provider, _olsrv2_addrtlvs, ARRAYSIZE(_olsrv2_addrtlvs))) {
    OONF_WARN(LOG_OLSRV2, "Count not register OLSRV2 msg contentprovider");
    rfc5444_writer_unregister_message(&_protocol->writer, _olsrv2_message);
    return -1;
  }

  return 0;
}